

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O2

int XMLSearch_search_set_tag(XMLSearch *search,SXML_CHAR *tag)

{
  char *pcVar1;
  uint uVar2;
  
  if (search == (XMLSearch *)0x0) {
    uVar2 = 0;
  }
  else if (tag == (SXML_CHAR *)0x0) {
    uVar2 = 1;
    if (search->tag != (SXML_CHAR *)0x0) {
      free(search->tag);
      search->tag = (SXML_CHAR *)0x0;
    }
  }
  else {
    pcVar1 = strdup(tag);
    search->tag = pcVar1;
    uVar2 = (uint)(pcVar1 != (char *)0x0);
  }
  return uVar2;
}

Assistant:

int XMLSearch_search_set_tag(XMLSearch* search, const SXML_CHAR* tag)
{
	if (search == NULL)
		return FALSE;

	if (tag == NULL) {
		if (search->tag != NULL) {
			__free(search->tag);
			search->tag = NULL;
		}
		return TRUE;
	}

	search->tag = sx_strdup(tag);
	return (search->tag != NULL);
}